

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type * __thiscall
FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>::dx
          (value_type *__return_storage_ptr__,FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_> *this
          ,int i)

{
  Fad<Fad<double>_> *pFVar1;
  FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> local_20;
  
  pFVar1 = this->right_;
  local_20.fadexpr_.left_ = &pFVar1->defaultVal;
  if ((pFVar1->dx_).num_elts != 0) {
    local_20.fadexpr_.left_ = (pFVar1->dx_).ptr_to_data + i;
  }
  local_20.fadexpr_.right_.constant_ = (this->left_).constant_;
  local_20.fadexpr_.right_.defaultVal = 0.0;
  Fad<double>::Fad<FadBinaryMul<Fad<double>,FadCst<double>>>(__return_storage_ptr__,&local_20);
  return __return_storage_ptr__;
}

Assistant:

const value_type dx(int i) const {return  right_.dx(i) * left_.val();}